

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv__make_pipe(int *fds,int flags)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = pipe2(fds,flags | 0x80000);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  return iVar1;
}

Assistant:

int uv__make_pipe(int fds[2], int flags) {
#if defined(__FreeBSD__) || defined(__linux__)
  if (pipe2(fds, flags | O_CLOEXEC))
    return UV__ERR(errno);

  return 0;
#else
  if (pipe(fds))
    return UV__ERR(errno);

  if (uv__cloexec(fds[0], 1))
    goto fail;

  if (uv__cloexec(fds[1], 1))
    goto fail;

  if (flags & UV__F_NONBLOCK) {
    if (uv__nonblock(fds[0], 1))
      goto fail;

    if (uv__nonblock(fds[1], 1))
      goto fail;
  }

  return 0;

fail:
  uv__close(fds[0]);
  uv__close(fds[1]);
  return UV__ERR(errno);
#endif
}